

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_get_group_sequence(PROPERTIES_HANDLE properties,sequence_no *group_sequence_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  PROPERTIES_INSTANCE *properties_instance;
  uint32_t item_count;
  int result;
  sequence_no *group_sequence_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x4232;
  }
  else {
    _item_count = group_sequence_value;
    group_sequence_value_local = (sequence_no *)properties;
    iVar1 = amqpvalue_get_composite_item_count
                      (properties->composite_value,(uint32_t *)&properties_instance);
    if (iVar1 == 0) {
      if ((uint)properties_instance < 0xc) {
        properties_instance._4_4_ = 0x4240;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(properties->composite_value,0xb);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          properties_instance._4_4_ = 0x4248;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            properties_instance._4_4_ = 0;
          }
          else {
            properties_instance._4_4_ = 0x424f;
          }
        }
      }
    }
    else {
      properties_instance._4_4_ = 0x423a;
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_get_group_sequence(PROPERTIES_HANDLE properties, sequence_no* group_sequence_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        if (amqpvalue_get_composite_item_count(properties_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 11)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(properties_instance->composite_value, 11);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_sequence_no(item_value, group_sequence_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}